

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void decode_bitfield(uint32_t data,bitfield_desc *bfdesc)

{
  bool bVar1;
  char *pcVar2;
  bool bVar3;
  int printed;
  uint32_t data_;
  bitfield_desc *bfdesc_local;
  uint32_t data_local;
  
  bVar1 = false;
  _printed = bfdesc;
  bfdesc_local._4_4_ = data;
  if (data == 0) {
    fprintf(_stdout,"%s","NONE");
  }
  while( true ) {
    bVar3 = false;
    if (bfdesc_local._4_4_ != 0) {
      bVar3 = _printed->name != (char *)0x0;
    }
    if (!bVar3) break;
    if ((bfdesc_local._4_4_ & _printed->mask) != 0) {
      pcVar2 = "";
      if (bVar1) {
        pcVar2 = ", ";
      }
      fprintf(_stdout,"%s%s",pcVar2,_printed->name);
      bfdesc_local._4_4_ = (_printed->mask ^ 0xffffffff) & bfdesc_local._4_4_;
      bVar1 = true;
    }
    _printed = _printed + 1;
  }
  if (bfdesc_local._4_4_ != 0) {
    pcVar2 = "";
    if (bVar1) {
      pcVar2 = ", ";
    }
    fprintf(_stdout,"%sUNK%x",pcVar2,(ulong)bfdesc_local._4_4_);
  }
  fprintf(_stdout," (0x%x)",(ulong)data);
  return;
}

Assistant:

void decode_bitfield(uint32_t data, struct bitfield_desc *bfdesc)
{
	uint32_t data_ = data;
	int printed = 0;

	if (!data)
		mmt_log_cont("%s", "NONE");

	while (data && bfdesc->name)
	{
		if (data & bfdesc->mask)
		{
			mmt_log_cont("%s%s", printed ? ", " : "", bfdesc->name);
			data &= ~bfdesc->mask;
			printed = 1;
		}
		bfdesc++;
	}

	if (data)
		mmt_log_cont("%sUNK%x", printed ? ", " : "", data);

	mmt_log_cont(" (0x%x)", data_);
}